

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O0

void dgrminer::find_isolated_nodes_and_addition_edges
               (AdjacencyListCrate *adjacency_list,
               vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
               *antecedent_pattern_edges_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_node_id_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_node_labels_ADDED,
               vector<int,_std::allocator<int>_> *antecedent_pattern_isolated_node_id,
               vector<int,_std::allocator<int>_> *antecedent_pattern_isolated_node_labels,
               vector<int,_std::allocator<int>_> *antecedent_pattern_isolated_node_changetime,
               PartialUnion *pu,bool search_for_anomalies,
               set<int,_std::less<int>,_std::allocator<int>_> *nodes_occupied_by_antecedent,
               set<int,_std::less<int>,_std::allocator<int>_> *edges_occupied_by_antecedent,
               set<int,_std::less<int>,_std::allocator<int>_> *occupied_node_ids_in_adj_list,
               int g_id,vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        *anomaly_pattern_edges,
               set<dgrminer::anomaly_pattern_with_occurrences,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
               *anomaly_patterns,bool debug)

{
  pointer *this;
  _Bit_pointer *ppuVar1;
  pointer *this_00;
  value_type vVar2;
  value_type_conflict vVar3;
  bool debug_00;
  undefined8 uVar4;
  pointer paVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  size_type sVar9;
  pointer paVar10;
  reference pvVar11;
  pointer paVar12;
  mapped_type *pmVar13;
  reference __x;
  reference pvVar14;
  reference pvVar15;
  size_type sVar16;
  reference pvVar17;
  ulong uVar18;
  reference pvVar19;
  reference pvVar20;
  pair<std::_Rb_tree_const_iterator<dgrminer::anomaly_pattern_with_occurrences>,_bool> pVar21;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar22;
  reference rVar23;
  bool local_635;
  byte local_629;
  bool local_5a9;
  bool local_59a;
  bool local_599;
  reference local_488;
  reference local_478;
  value_type_conflict local_468;
  bool local_461;
  undefined1 auStack_460 [7];
  bool are_same;
  _Bit_type local_458;
  _Self local_450;
  _Self local_448;
  byte local_439;
  iterator iStack_438;
  bool is_occupied_by_frequent_pattern;
  _Self local_430;
  byte local_425;
  int local_424;
  bool is_occupied_in_adj_nodes;
  int node_candidate_index;
  bool should_backtrack;
  _Rb_tree_const_iterator<dgrminer::anomaly_pattern_with_occurrences> _Stack_418;
  undefined1 local_410;
  _Base_ptr local_408;
  undefined1 local_400;
  _Base_ptr local_3f8;
  undefined1 local_3f0;
  _Self local_3e8;
  _Self local_3e0;
  iterator it_1;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> local_3c0;
  undefined1 local_3a8 [8];
  anomaly_pattern_with_occurrences ap_1;
  iterator iStack_340;
  bool is_only_addition_pattern;
  _Self local_338;
  byte local_329;
  iterator iStack_328;
  bool is_edge_nondummy;
  _Self local_320;
  bool local_311;
  iterator iStack_310;
  bool is_dst_vertex_nondummy;
  _Self local_308;
  bool local_2f9;
  ulong uStack_2f8;
  bool is_src_vertex_nondummy;
  size_t k;
  array<int,_10UL> anomaly_edge;
  size_t j;
  ulong uStack_2b8;
  int num_of_dummy_elements;
  size_t i_3;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> anomaly_pattern_edges_all_1
  ;
  size_t i_2;
  undefined1 local_278 [8];
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  maximal_patterns_of_addition_edges;
  _Self local_258;
  _Self local_250;
  iterator new_it;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  vector_of_edge_sets;
  set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  sets_of_used_edges;
  ulong local_1f8;
  size_t i_1;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  from_pattern_id_to_adj_id_map;
  _Self local_190;
  _Self local_188;
  iterator it;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> local_168;
  undefined1 local_150 [8];
  anomaly_pattern_with_occurrences ap;
  size_t i;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> anomaly_pattern_edges_all;
  int local_c8;
  int isolated_vertex_current_index;
  allocator<bool> local_b2;
  bool local_b1;
  undefined1 local_b0 [8];
  vector<bool,_std::allocator<bool>_> adjacency_nodes_are_used;
  vector<int,_std::allocator<int>_> which_indices_were_used;
  vector<int,_std::allocator<int>_> selected_ids_from_adj;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> adj_list_nodes;
  bool debug_local;
  bool search_for_anomalies_local;
  vector<int,_std::allocator<int>_> *antecedent_pattern_isolated_node_labels_local;
  vector<int,_std::allocator<int>_> *antecedent_pattern_isolated_node_id_local;
  vector<int,_std::allocator<int>_> *antecedent_pattern_node_labels_ADDED_local;
  vector<int,_std::allocator<int>_> *antecedent_pattern_node_id_ADDED_local;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
  *antecedent_pattern_edges_ADDED_local;
  AdjacencyListCrate *adjacency_list_local;
  
  debug_00 = debug;
  this = &selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)this,
             &adjacency_list->nodes);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  sVar9 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                    ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)this);
  local_b1 = false;
  std::allocator<bool>::allocator(&local_b2);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_b0,sVar9,&local_b1,&local_b2);
  std::allocator<bool>::~allocator(&local_b2);
  local_c8 = 0;
  anomaly_pattern_edges_all.
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage,
             (value_type_conflict *)
             ((long)&anomaly_pattern_edges_all.
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  do {
    sVar9 = std::vector<int,_std::allocator<int>_>::size(antecedent_pattern_isolated_node_id);
    if (sVar9 <= (ulong)(long)local_c8) {
      sVar9 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                        (antecedent_pattern_edges_ADDED);
      if (sVar9 == 0) {
        std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
                  ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)&i);
        ap.minimum_code.
        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        while( true ) {
          paVar5 = ap.minimum_code.
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          paVar10 = (pointer)std::
                             vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                             ::size(anomaly_pattern_edges);
          if (paVar10 <= paVar5) break;
          pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                    operator[](anomaly_pattern_edges,
                               (size_type)
                               ap.minimum_code.
                               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                    ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)&i,
                     pvVar11);
          ap.minimum_code.
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)(ap.minimum_code.
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems + 1);
        }
        anomaly_pattern_with_occurrences::anomaly_pattern_with_occurrences
                  ((anomaly_pattern_with_occurrences *)local_150);
        std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator=
                  ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                   local_150,
                   (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)&i);
        std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
                  ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)&it,
                   (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)&i);
        compute_min_code(&local_168,
                         (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                         &it);
        std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator=
                  ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                   &ap.occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_168);
        std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
                  (&local_168);
        std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
                  ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)&it);
        local_188._M_node =
             (_Base_ptr)
             std::
             set<dgrminer::anomaly_pattern_with_occurrences,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
             ::find(anomaly_patterns,(key_type *)local_150);
        local_190._M_node =
             (_Base_ptr)
             std::
             end<std::set<dgrminer::anomaly_pattern_with_occurrences,std::less<dgrminer::anomaly_pattern_with_occurrences>,std::allocator<dgrminer::anomaly_pattern_with_occurrences>>>
                       (anomaly_patterns);
        bVar6 = std::operator!=(&local_188,&local_190);
        if (bVar6) {
          paVar12 = std::_Rb_tree_const_iterator<dgrminer::anomaly_pattern_with_occurrences>::
                    operator->(&local_188);
          std::set<int,_std::less<int>,_std::allocator<int>_>::insert(&paVar12->occurrences,&g_id);
        }
        else {
          std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     &ap.anomalous_pattern_edges.
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&g_id);
          pVar21 = std::
                   set<dgrminer::anomaly_pattern_with_occurrences,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
                   ::insert(anomaly_patterns,(value_type *)local_150);
          from_pattern_id_to_adj_id_map._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)pVar21.first._M_node;
        }
        anomaly_pattern_with_occurrences::~anomaly_pattern_with_occurrences
                  ((anomaly_pattern_with_occurrences *)local_150);
        std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
                  ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)&i);
      }
      else {
        std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::map
                  ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *)
                   &i_1);
        local_1f8 = 0;
        while( true ) {
          sVar9 = std::vector<int,_std::allocator<int>_>::size(antecedent_pattern_isolated_node_id);
          if (sVar9 <= local_1f8) break;
          pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &which_indices_were_used.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,local_1f8);
          vVar2 = *pvVar17;
          pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                              (antecedent_pattern_isolated_node_id,local_1f8);
          sets_of_used_edges._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
               (undefined1)*pvVar17;
          pmVar13 = std::
                    map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                    operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                *)&i_1,(key_type_conflict *)
                                       ((long)&sets_of_used_edges._M_t._M_impl.super__Rb_tree_header
                                               ._M_node_count + 7));
          *pmVar13 = vVar2;
          local_1f8 = local_1f8 + 1;
        }
        this_00 = &vector_of_edge_sets.
                   super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::set((set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
               *)this_00);
        find_addition_nodes_and_edges
                  (adjacency_list,antecedent_pattern_edges_ADDED,antecedent_pattern_node_id_ADDED,
                   antecedent_pattern_node_labels_ADDED,
                   (map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *)
                   &i_1,(vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                        &selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage,
                   (set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                    *)this_00,nodes_occupied_by_antecedent,edges_occupied_by_antecedent,debug_00);
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::vector((vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                  *)&new_it);
        local_250._M_node =
             (_Base_ptr)
             std::
             set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
             ::begin((set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                      *)&vector_of_edge_sets.
                         super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        while( true ) {
          local_258._M_node =
               (_Base_ptr)
               std::
               set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
               ::end((set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                      *)&vector_of_edge_sets.
                         super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar6 = std::operator!=(&local_250,&local_258);
          if (!bVar6) break;
          __x = std::_Rb_tree_const_iterator<dgrminer::non_dummy_vertices_and_edges>::operator*
                          (&local_250);
          std::
          vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
          ::push_back((vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                       *)&new_it,__x);
          maximal_patterns_of_addition_edges.
          super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)std::_Rb_tree_const_iterator<dgrminer::non_dummy_vertices_and_edges>::
                        operator++(&local_250,0);
        }
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::vector((vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                  *)&i_2,(vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                          *)&new_it);
        find_maximal_subsets_of_ndve
                  ((vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                    *)local_278,
                   (vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                    *)&i_2);
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::~vector((vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                   *)&i_2);
        anomaly_pattern_edges_all_1.
        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        while( true ) {
          paVar5 = anomaly_pattern_edges_all_1.
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          paVar10 = (pointer)std::
                             vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                             ::size((vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                     *)local_278);
          if (paVar10 <= paVar5) break;
          std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
                    ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)&i_3)
          ;
          uStack_2b8 = 0;
          while( true ) {
            sVar9 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                    size(anomaly_pattern_edges);
            if (sVar9 <= uStack_2b8) break;
            pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                      operator[](anomaly_pattern_edges,uStack_2b8);
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                      ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                       &i_3,pvVar11);
            uStack_2b8 = uStack_2b8 + 1;
          }
          j._4_4_ = 0;
          anomaly_edge._M_elems[8] = 0;
          anomaly_edge._M_elems[9] = 0;
          while( true ) {
            uVar4 = anomaly_edge._M_elems._32_8_;
            sVar9 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                    size(antecedent_pattern_edges_ADDED);
            if (sVar9 <= (ulong)uVar4) break;
            for (uStack_2f8 = 0; uStack_2f8 < 10; uStack_2f8 = uStack_2f8 + 1) {
              pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        ::operator[](antecedent_pattern_edges_ADDED,anomaly_edge._M_elems._32_8_);
              pvVar14 = std::array<int,_10UL>::operator[](pvVar11,uStack_2f8);
              vVar3 = *pvVar14;
              pvVar14 = std::array<int,_10UL>::operator[]((array<int,_10UL> *)&k,uStack_2f8);
              *pvVar14 = vVar3;
            }
            pvVar15 = std::
                      vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                      ::operator[]((vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                    *)local_278,
                                   (size_type)
                                   anomaly_pattern_edges_all_1.
                                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                      operator[](antecedent_pattern_edges_ADDED,anomaly_edge._M_elems._32_8_);
            pvVar14 = std::array<int,_10UL>::operator[](pvVar11,0);
            local_308._M_node =
                 (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::find
                           (&pvVar15->non_dummy_vertices,pvVar14);
            pvVar15 = std::
                      vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                      ::operator[]((vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                    *)local_278,
                                   (size_type)
                                   anomaly_pattern_edges_all_1.
                                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            iStack_310 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                                   (&pvVar15->non_dummy_vertices);
            local_2f9 = std::operator!=(&local_308,&stack0xfffffffffffffcf0);
            pvVar15 = std::
                      vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                      ::operator[]((vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                    *)local_278,
                                   (size_type)
                                   anomaly_pattern_edges_all_1.
                                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                      operator[](antecedent_pattern_edges_ADDED,anomaly_edge._M_elems._32_8_);
            pvVar14 = std::array<int,_10UL>::operator[](pvVar11,1);
            local_320._M_node =
                 (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::find
                           (&pvVar15->non_dummy_vertices,pvVar14);
            pvVar15 = std::
                      vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                      ::operator[]((vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                    *)local_278,
                                   (size_type)
                                   anomaly_pattern_edges_all_1.
                                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            iStack_328 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                                   (&pvVar15->non_dummy_vertices);
            local_311 = std::operator!=(&local_320,&stack0xfffffffffffffcd8);
            pvVar15 = std::
                      vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                      ::operator[]((vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                    *)local_278,
                                   (size_type)
                                   anomaly_pattern_edges_all_1.
                                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                      operator[](antecedent_pattern_edges_ADDED,anomaly_edge._M_elems._32_8_);
            pvVar14 = std::array<int,_10UL>::operator[](pvVar11,9);
            local_338._M_node =
                 (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::find
                           (&pvVar15->non_dummy_edges,pvVar14);
            pvVar15 = std::
                      vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                      ::operator[]((vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                    *)local_278,
                                   (size_type)
                                   anomaly_pattern_edges_all_1.
                                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            iStack_340 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                                   (&pvVar15->non_dummy_edges);
            local_329 = std::operator!=(&local_338,&stack0xfffffffffffffcc0);
            local_599 = true;
            if ((local_2f9 & 1U) == 0) {
              pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        ::operator[](antecedent_pattern_edges_ADDED,anomaly_edge._M_elems._32_8_);
              pvVar14 = std::array<int,_10UL>::operator[](pvVar11,3);
              local_599 = *pvVar14 != 0;
            }
            local_2f9 = local_599;
            local_59a = true;
            if ((local_311 & 1U) == 0) {
              pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        ::operator[](antecedent_pattern_edges_ADDED,anomaly_edge._M_elems._32_8_);
              pvVar14 = std::array<int,_10UL>::operator[](pvVar11,8);
              local_59a = *pvVar14 != 0;
            }
            local_311 = local_59a;
            if ((local_2f9 & 1U) == 0) {
              pvVar14 = std::array<int,_10UL>::operator[]((array<int,_10UL> *)&k,2);
              iVar7 = PartialUnion::getDummyLabel(pu,*pvVar14);
              pvVar14 = std::array<int,_10UL>::operator[]((array<int,_10UL> *)&k,2);
              *pvVar14 = iVar7;
            }
            if ((local_311 & 1U) == 0) {
              pvVar14 = std::array<int,_10UL>::operator[]((array<int,_10UL> *)&k,7);
              iVar7 = PartialUnion::getDummyLabel(pu,*pvVar14);
              pvVar14 = std::array<int,_10UL>::operator[]((array<int,_10UL> *)&k,7);
              *pvVar14 = iVar7;
            }
            if ((local_329 & 1) == 0) {
              pvVar14 = std::array<int,_10UL>::operator[]((array<int,_10UL> *)&k,5);
              iVar7 = PartialUnion::getDummyLabel(pu,*pvVar14);
              pvVar14 = std::array<int,_10UL>::operator[]((array<int,_10UL> *)&k,5);
              *pvVar14 = iVar7;
            }
            j._4_4_ = j._4_4_ + ((byte)~local_2f9 & 1) + ((byte)~local_311 & 1) +
                                ((byte)~local_329 & 1);
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                      ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                       &i_3,(value_type *)&k);
            anomaly_edge._M_elems._32_8_ = anomaly_edge._M_elems._32_8_ + 1;
          }
          sVar9 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                            (anomaly_pattern_edges);
          local_5a9 = false;
          if (sVar9 == 0) {
            sVar9 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                    size(antecedent_pattern_edges_ADDED);
            local_5a9 = sVar9 * 3 - (long)j._4_4_ == 0;
          }
          ap_1.minimum_code.
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._7_1_ = local_5a9;
          if (local_5a9 == false) {
LAB_0012503f:
            anomaly_pattern_with_occurrences::anomaly_pattern_with_occurrences
                      ((anomaly_pattern_with_occurrences *)local_3a8);
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator=
                      ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                       local_3a8,
                       (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                       &i_3);
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
                      ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                       &it_1,(vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                              *)&i_3);
            compute_min_code(&local_3c0,
                             (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                              *)&it_1);
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator=
                      ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                       &ap_1.occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_3c0
                      );
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
                      (&local_3c0);
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
                      ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                       &it_1);
            local_3e0._M_node =
                 (_Base_ptr)
                 std::
                 set<dgrminer::anomaly_pattern_with_occurrences,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
                 ::find(anomaly_patterns,(key_type *)local_3a8);
            local_3e8._M_node =
                 (_Base_ptr)
                 std::
                 end<std::set<dgrminer::anomaly_pattern_with_occurrences,std::less<dgrminer::anomaly_pattern_with_occurrences>,std::allocator<dgrminer::anomaly_pattern_with_occurrences>>>
                           (anomaly_patterns);
            bVar6 = std::operator!=(&local_3e0,&local_3e8);
            if (bVar6) {
              paVar12 = std::_Rb_tree_const_iterator<dgrminer::anomaly_pattern_with_occurrences>::
                        operator->(&local_3e0);
              pVar22 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                 (&paVar12->occurrences,&g_id);
              local_3f8 = (_Base_ptr)pVar22.first._M_node;
              local_3f0 = pVar22.second;
            }
            else {
              pVar22 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                  &ap_1.anomalous_pattern_edges.
                                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&g_id);
              local_408 = (_Base_ptr)pVar22.first._M_node;
              local_400 = pVar22.second;
              pVar21 = std::
                       set<dgrminer::anomaly_pattern_with_occurrences,_std::less<dgrminer::anomaly_pattern_with_occurrences>,_std::allocator<dgrminer::anomaly_pattern_with_occurrences>_>
                       ::insert(anomaly_patterns,(value_type *)local_3a8);
              _Stack_418 = pVar21.first._M_node;
              local_410 = pVar21.second;
            }
            anomaly_pattern_with_occurrences::~anomaly_pattern_with_occurrences
                      ((anomaly_pattern_with_occurrences *)local_3a8);
          }
          else {
            sVar16 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                               (nodes_occupied_by_antecedent);
            if (sVar16 == 0) goto LAB_0012503f;
          }
          std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
                    ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)&i_3)
          ;
          anomaly_pattern_edges_all_1.
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)(anomaly_pattern_edges_all_1.
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems + 1);
        }
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::~vector((vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                   *)local_278);
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::~vector((vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                   *)&new_it);
        std::
        set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::~set((set<dgrminer::non_dummy_vertices_and_edges,_std::less<dgrminer::non_dummy_vertices_and_edges>,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                *)&vector_of_edge_sets.
                   super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::~map
                  ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *)
                   &i_1);
      }
      sVar9 = std::vector<int,_std::allocator<int>_>::size(antecedent_pattern_isolated_node_id);
      if (sVar9 == 0) {
        node_candidate_index = 1;
        goto LAB_00125711;
      }
    }
    is_occupied_in_adj_nodes = true;
    pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage,(long)local_c8);
    local_424 = *pvVar17;
    while( true ) {
      uVar18 = (ulong)local_424;
      sVar9 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                        ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                         &selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar9 <= uVar18) break;
      local_430._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     (occupied_node_ids_in_adj_list,&local_424);
      iStack_438 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                             (occupied_node_ids_in_adj_list);
      local_425 = std::operator!=(&local_430,&stack0xfffffffffffffbc8);
      local_448._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     (nodes_occupied_by_antecedent,&local_424);
      local_450._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end(nodes_occupied_by_antecedent);
      local_439 = std::operator!=(&local_448,&local_450);
      rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_b0,(long)local_424);
      _auStack_460 = rVar23;
      bVar6 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_460);
      local_629 = 0;
      if ((!bVar6) && (local_629 = 0, (local_425 & 1) == 0)) {
        local_629 = local_439 ^ 0xff;
      }
      if ((local_629 & 1) != 0) {
        pvVar19 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                  operator[]((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *
                             )&selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_424);
        pvVar20 = std::array<int,_3UL>::operator[](pvVar19,2);
        iVar7 = PartialUnion::getAntecedentLabel(pu,*pvVar20);
        pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                            (antecedent_pattern_isolated_node_labels,(long)local_c8);
        iVar8 = PartialUnion::getAntecedentLabel(pu,*pvVar17);
        local_635 = false;
        if (iVar7 == iVar8) {
          pvVar19 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                    operator[]((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                *)&selected_ids_from_adj.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,(long)local_424);
          pvVar20 = std::array<int,_3UL>::operator[](pvVar19,1);
          iVar7 = PartialUnion::getAntecedentChangetime(pu,*pvVar20);
          pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                              (antecedent_pattern_isolated_node_changetime,(long)local_c8);
          iVar8 = PartialUnion::getAntecedentChangetime(pu,*pvVar17);
          local_635 = iVar7 == iVar8;
        }
        local_461 = local_635;
        if (local_635 != false) {
          is_occupied_in_adj_nodes = false;
          iVar7 = local_424 + 1;
          ppuVar1 = &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage;
          pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)ppuVar1,(long)local_c8);
          *pvVar17 = iVar7;
          local_468 = 0;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)ppuVar1,&local_468);
          pvVar19 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                    operator[]((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                *)&selected_ids_from_adj.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,(long)local_424);
          pvVar20 = std::array<int,_3UL>::operator[](pvVar19,0);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,pvVar20);
          rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_b0,(long)local_424);
          local_478 = rVar23;
          std::_Bit_reference::operator=(&local_478,true);
          local_c8 = local_c8 + 1;
          break;
        }
      }
      local_424 = local_424 + 1;
    }
    if ((local_c8 != 0) && ((is_occupied_in_adj_nodes & 1U) != 0)) {
      ppuVar1 = &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage;
      std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)ppuVar1)
      ;
      pvVar17 = std::vector<int,_std::allocator<int>_>::back
                          ((vector<int,_std::allocator<int>_> *)ppuVar1);
      rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_b0,(long)(*pvVar17 + -1));
      local_488 = rVar23;
      std::_Bit_reference::operator=(&local_488,false);
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)
                 &which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      local_c8 = local_c8 + -1;
    }
  } while ((local_c8 != 0) || ((is_occupied_in_adj_nodes & 1U) == 0));
  node_candidate_index = 0;
LAB_00125711:
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_b0)
  ;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &adjacency_nodes_are_used.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &which_indices_were_used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             &selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void find_isolated_nodes_and_addition_edges(AdjacencyListCrate & adjacency_list, std::vector<std::array<int, PAT___SIZE>> & antecedent_pattern_edges_ADDED,
		std::vector<int> & antecedent_pattern_node_id_ADDED,
		std::vector<int> & antecedent_pattern_node_labels_ADDED,
		std::vector<int> & antecedent_pattern_isolated_node_id,
		std::vector<int> & antecedent_pattern_isolated_node_labels,
		std::vector<int> & antecedent_pattern_isolated_node_changetime, PartialUnion pu, bool search_for_anomalies,
		std::set<int> & nodes_occupied_by_antecedent, std::set<int> & edges_occupied_by_antecedent,
		std::set<int> & occupied_node_ids_in_adj_list,
		int g_id,
		std::vector<std::array<int, PAT___SIZE>> & anomaly_pattern_edges,
		std::set<anomaly_pattern_with_occurrences> & anomaly_patterns,
		bool debug)
	{
		std::vector<std::array<int, ADJ_NODES___SIZE>> adj_list_nodes = adjacency_list.nodes;
		std::vector<int> selected_ids_from_adj; // which IDS of adj nodes correspond to those in antecedent_pattern_isolated_node_id
		std::vector<int> which_indices_were_used; // here we save the currently used indices for backtracking
		std::vector<bool> adjacency_nodes_are_used(adj_list_nodes.size(), false); // here we save which nodes from the adjacency list are already used

		// DO DFS:

		int isolated_vertex_current_index = 0; // we want to process the the first isolated vertex
		which_indices_were_used.push_back(0); // for the first isolated node, we want to start from the first node of adjacency list

		while (true)
		{
			// if all isolated nodes were mapped (found):
			if (antecedent_pattern_isolated_node_id.size() <= isolated_vertex_current_index)
			{
				// and there are no addition edges (and thus also no addition nodes because of the connectedness of the pattern), just save the pattern:
				if (antecedent_pattern_edges_ADDED.size() == 0)
				{
					std::vector<std::array<int, PAT___SIZE>> anomaly_pattern_edges_all;
					for (size_t i = 0; i < anomaly_pattern_edges.size(); i++)
					{
						anomaly_pattern_edges_all.push_back(anomaly_pattern_edges[i]);
					}
					// save the anomalous pattern with its occurrences - only regular edges
					anomaly_pattern_with_occurrences ap;
					ap.anomalous_pattern_edges = anomaly_pattern_edges_all;
					ap.minimum_code = compute_min_code(anomaly_pattern_edges_all);
					auto it = anomaly_patterns.find(ap);
					if (it != std::end(anomaly_patterns))
					{

						(it->occurrences).insert(g_id);
					}
					else
					{
						ap.occurrences.insert(g_id);
						anomaly_patterns.insert(ap);
					}
				}
				// but if there are also some addition edges (possibly with addition nodes), try to find them:
				else
				{
					std::map<char, int> from_pattern_id_to_adj_id_map;
					for (size_t i = 0; i < antecedent_pattern_isolated_node_id.size(); i++)
					{
						from_pattern_id_to_adj_id_map[antecedent_pattern_isolated_node_id[i]] = selected_ids_from_adj[i];
					}

					// OUTPUT of find_addition_nodes_and_edges will be here:
					std::set<non_dummy_vertices_and_edges> sets_of_used_edges;
					find_addition_nodes_and_edges(adjacency_list, antecedent_pattern_edges_ADDED, antecedent_pattern_node_id_ADDED, antecedent_pattern_node_labels_ADDED, from_pattern_id_to_adj_id_map,
						adj_list_nodes, sets_of_used_edges, nodes_occupied_by_antecedent, edges_occupied_by_antecedent, debug);
					// process sets_of_used_edges (keep only maximal subsets)
					std::vector<non_dummy_vertices_and_edges> vector_of_edge_sets;
					for (set< non_dummy_vertices_and_edges >::iterator new_it = sets_of_used_edges.begin(); new_it != sets_of_used_edges.end(); new_it++)
					{
						vector_of_edge_sets.push_back(*new_it);
					}
					// here we get the IDs of non-dummy pattern edges and nodes; only maximal subsets (all other IDs are dummy)

					std::vector<non_dummy_vertices_and_edges> maximal_patterns_of_addition_edges = find_maximal_subsets_of_ndve(vector_of_edge_sets);

					// now for each such maximal set of addition patterns, create one anomaly pattern:
					for (size_t i = 0; i < maximal_patterns_of_addition_edges.size(); i++)
					{
						std::vector<std::array<int, PAT___SIZE>> anomaly_pattern_edges_all;
						for (size_t i = 0; i < anomaly_pattern_edges.size(); i++)
						{
							anomaly_pattern_edges_all.push_back(anomaly_pattern_edges[i]);
						}

						// add addition edges to anomaly_pattern_edges_all:
						// we need to mark dummy vertices and edges:

						int num_of_dummy_elements = 0;

                        // checking these addition edges:
						for (size_t j = 0; j < antecedent_pattern_edges_ADDED.size(); j++)
						{
							std::array<int, PAT___SIZE> anomaly_edge;
							// first just copy the edge as it is:
							for (size_t k = 0; k < PAT___SIZE; k++)
							{
								anomaly_edge[k] = antecedent_pattern_edges_ADDED[j][k];
							}
							
							// then, if there are some dummy elements, modify them:
							// if they were "addition nodes" then we must check it by using the results from find_addition_nodes_and_edges()
							bool is_src_vertex_nondummy = maximal_patterns_of_addition_edges[i].non_dummy_vertices.find(antecedent_pattern_edges_ADDED[j][PAT_SRC_ID]) != maximal_patterns_of_addition_edges[i].non_dummy_vertices.end();
							bool is_dst_vertex_nondummy = maximal_patterns_of_addition_edges[i].non_dummy_vertices.find(antecedent_pattern_edges_ADDED[j][PAT_DST_ID]) != maximal_patterns_of_addition_edges[i].non_dummy_vertices.end();
							bool is_edge_nondummy = maximal_patterns_of_addition_edges[i].non_dummy_edges.find(antecedent_pattern_edges_ADDED[j][PAT_ID]) != maximal_patterns_of_addition_edges[i].non_dummy_edges.end();

							// if they are not "addition" nodes, then it is clear that these nodes are not dummy:
							is_src_vertex_nondummy = is_src_vertex_nondummy || (antecedent_pattern_edges_ADDED[j][PAT_SRC_CHANGETIME] != 0);
							is_dst_vertex_nondummy = is_dst_vertex_nondummy || (antecedent_pattern_edges_ADDED[j][PAT_DST_CHANGETIME] != 0);

							if (!is_src_vertex_nondummy) anomaly_edge[PAT_SRC_LABEL] = pu.getDummyLabel(anomaly_edge[PAT_SRC_LABEL]);
							if (!is_dst_vertex_nondummy) anomaly_edge[PAT_DST_LABEL] = pu.getDummyLabel(anomaly_edge[PAT_DST_LABEL]);
							if (!is_edge_nondummy) anomaly_edge[PAT_LABEL] = pu.getDummyLabel(anomaly_edge[PAT_LABEL]);

							num_of_dummy_elements += (!is_src_vertex_nondummy + !is_dst_vertex_nondummy + !is_edge_nondummy);

							anomaly_pattern_edges_all.push_back(anomaly_edge);
						}

						// if there are no regular edges from the antecedent and all "ADDITION" edges contain only DUMMY elements, then the pattern is pure "ADDITION-DUMMY"
						bool is_only_addition_pattern = (anomaly_pattern_edges.size() == 0) && (antecedent_pattern_edges_ADDED.size() * 3 == num_of_dummy_elements);

						// we cannot save patterns which are pure "ADDITION-DUMMY" if the current snapshot contain the frequent pattern
						// (more precisely, we don't save the occurrence)
						if (!is_only_addition_pattern || nodes_occupied_by_antecedent.size() == 0)
						{
							// and now save the anomalous pattern with its occurrences 
							anomaly_pattern_with_occurrences ap;
							ap.anomalous_pattern_edges = anomaly_pattern_edges_all;
							ap.minimum_code = compute_min_code(anomaly_pattern_edges_all);
							auto it = anomaly_patterns.find(ap);
							if (it != std::end(anomaly_patterns))
							{

								(it->occurrences).insert(g_id);
							}
							else
							{
								ap.occurrences.insert(g_id);
								anomaly_patterns.insert(ap);
							}
						}


					}
				}
                // ALL FOUND ISOLATED VERTICES PROCESSED

				// if there were no isolated vertices, just end after all anomaly patterns were saved
				if (antecedent_pattern_isolated_node_id.size() == 0)
				{
					return;
				}

				// NOW WE may try different solution
			}

			// try to map next isolated node:
			bool should_backtrack = true;
			for (int node_candidate_index = which_indices_were_used[isolated_vertex_current_index]; node_candidate_index < adj_list_nodes.size(); node_candidate_index++)
			{
				// if the current adjacency node wasn't used yet, AND it ins't occupied by the mapped antecedent edges, AND it is not occupied by the FREQUENT PATTERN antecedent:
				bool is_occupied_in_adj_nodes = occupied_node_ids_in_adj_list.find(node_candidate_index) != occupied_node_ids_in_adj_list.end();
				bool is_occupied_by_frequent_pattern = nodes_occupied_by_antecedent.find(node_candidate_index) != nodes_occupied_by_antecedent.end();
				if (!adjacency_nodes_are_used[node_candidate_index] && !is_occupied_in_adj_nodes && !is_occupied_by_frequent_pattern)
				{
					// if it is same as that isolated vertex:
					// (we must take the antecedent info of both nodes)
					bool are_same = pu.getAntecedentLabel(adj_list_nodes[node_candidate_index][ADJ_NODES_LABEL]) == pu.getAntecedentLabel(antecedent_pattern_isolated_node_labels[isolated_vertex_current_index]) &&
						pu.getAntecedentChangetime(adj_list_nodes[node_candidate_index][ADJ_NODES_CHANGETIME]) == pu.getAntecedentChangetime(antecedent_pattern_isolated_node_changetime[isolated_vertex_current_index]);

					if (are_same)
					{
						should_backtrack = false;

						which_indices_were_used[isolated_vertex_current_index] = node_candidate_index + 1;
						which_indices_were_used.push_back(0);
						selected_ids_from_adj.push_back(adj_list_nodes[node_candidate_index][ADJ_NODES_ID]);
						adjacency_nodes_are_used[node_candidate_index] = true;
						isolated_vertex_current_index++;
						break;
					}
				}
			}

			// if we could not map this isolated vertex, backtrack:
			if (isolated_vertex_current_index != 0 && should_backtrack)
			{
				which_indices_were_used.pop_back();

				adjacency_nodes_are_used[which_indices_were_used.back() - 1] = false;

				selected_ids_from_adj.pop_back();

				isolated_vertex_current_index--;
			}
			if (isolated_vertex_current_index == 0 && should_backtrack)
			{
				// we tried all combinations, just end:
				break;
			}
		}
	}